

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O2

void UI::interactive_mode(void)

{
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  print_welcome();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             " Katana can be quickly run with input arguments or be run interactively.",&local_49);
  print_ln(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48," Katana is currently running in interactive mode.",&local_49);
  print_ln(&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  skip_ln();
  main_menu();
  return;
}

Assistant:

void UI::interactive_mode()
{
    print_welcome();
    print_ln(" Katana can be quickly run with input arguments or be run interactively.");
    print_ln(" Katana is currently running in interactive mode.");
    skip_ln();
    main_menu();
}